

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall
CTcTokenizer::expand_macro
          (CTcTokenizer *this,CTcMacroRsc *rsc,CTcTokString *expbuf,CTcTokString *srcbuf,
          utf8_ptr *src,size_t macro_srcbuf_ofs,CTcHashEntryPp *entry,int read_more,
          int allow_defined,int *expanded)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcTokString *in_RCX;
  long *in_RDX;
  long in_RSI;
  utf8_ptr *in_R8;
  long in_R9;
  CTcHashEntryPp *in_stack_00000008;
  undefined4 *in_stack_00000020;
  int found_actuals;
  char flagbuf [9];
  int err;
  char *end;
  char *start;
  size_t startofs;
  size_t arglen [128];
  size_t argofs [128];
  CTcTokString *subexp;
  int local_864;
  undefined1 local_85d [13];
  char *local_850;
  char *local_848;
  long local_840;
  size_t *in_stack_fffffffffffff860;
  size_t *in_stack_fffffffffffff868;
  CTcHashEntryPp *in_stack_fffffffffffff870;
  utf8_ptr *in_stack_fffffffffffff878;
  CTcTokString *in_stack_fffffffffffff880;
  CTcTokenizer *in_stack_fffffffffffff888;
  int in_stack_fffffffffffff8a0;
  int *in_stack_fffffffffffff8a8;
  size_t *in_stack_fffffffffffffab0;
  CTcTokString *in_stack_fffffffffffffab8;
  CTcHashEntryPp *in_stack_fffffffffffffac0;
  CTcTokString *in_stack_fffffffffffffac8;
  CTcMacroRsc *in_stack_fffffffffffffad0;
  CTcTokenizer *in_stack_fffffffffffffad8;
  size_t *in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf8;
  
  *in_stack_00000020 = 0;
  pcVar3 = utf8_ptr::getptr(in_R8);
  pcVar4 = CTcTokString::get_text(in_RCX);
  local_840 = (long)pcVar3 - (long)pcVar4;
  (**(code **)(*in_RDX + 0x48))();
  iVar1 = CTcHashEntryPp::has_args(in_stack_00000008);
  if (iVar1 != 0) {
    iVar1 = parse_macro_actuals(in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                                in_stack_fffffffffffff878,in_stack_fffffffffffff870,
                                in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                                in_stack_fffffffffffff8a0,in_stack_fffffffffffff8a8);
    if (iVar1 != 0) {
      return 1;
    }
    if (local_864 == 0) {
      pcVar3 = CTcTokString::get_text(in_RCX);
      (**(code **)(*in_RDX + 0x40))(in_RDX,pcVar3 + in_R9,local_840 - in_R9);
      pcVar3 = CTcTokString::get_text(in_RCX);
      utf8_ptr::set(in_R8,pcVar3 + local_840);
      return 0;
    }
  }
  iVar1 = CTcHashEntryPp::get_argc(in_stack_00000008);
  if (iVar1 == 0) {
    iVar1 = (*(in_stack_00000008->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[3])();
    local_848 = (char *)CONCAT44(extraout_var,iVar1);
    iVar2 = (*(in_stack_00000008->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[4])();
    local_850 = (char *)CONCAT44(extraout_var,iVar1) + CONCAT44(extraout_var_00,iVar2);
  }
  else {
    iVar1 = substitute_macro_actuals
                      (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_stack_fffffffffffffac8
                       ,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                       in_stack_fffffffffffffab0,in_stack_fffffffffffffaf0,in_stack_fffffffffffffaf8
                      );
    if (iVar1 != 0) {
      return 1;
    }
    pcVar3 = CTcTokString::get_text((CTcTokString *)(in_RSI + 0x20));
    local_848 = pcVar3;
    sVar5 = CTcTokString::get_text_len((CTcTokString *)(in_RSI + 0x20));
    local_850 = pcVar3 + sVar5;
  }
  (**(code **)(*in_RDX + 0x40))(in_RDX,local_848,(long)local_850 - (long)local_848);
  local_85d[0] = 3;
  (**(code **)(*in_RDX + 0x20))(in_RDX,local_85d,9);
  *in_stack_00000020 = 1;
  return 0;
}

Assistant:

int CTcTokenizer::expand_macro(CTcMacroRsc *rsc, CTcTokString *expbuf,
                               const CTcTokString *srcbuf, utf8_ptr *src,
                               size_t macro_srcbuf_ofs,
                               CTcHashEntryPp *entry, int read_more,
                               int allow_defined, int *expanded)
{
    CTcTokString *subexp;
    size_t argofs[TOK_MAX_MACRO_ARGS];
    size_t arglen[TOK_MAX_MACRO_ARGS];
    size_t startofs;
    const char *start;
    const char *end;
    int err;
    char flagbuf[1 + sizeof(entry)];

    /* presume we won't do any expansion */
    *expanded = FALSE;

    /* get our resources */
    subexp = &rsc->macro_exp_;

    /* remember our parsing starting offset */
    startofs = src->getptr() - srcbuf->get_text();

    /* clear the expansion output buffer */
    expbuf->clear_text();

    /* if the macro has arguments, scan the actuals */
    if (entry->has_args())
    {
        int found_actuals;

        /* read the macro arguments */
        if (parse_macro_actuals(srcbuf, src, entry, argofs, arglen,
                                read_more, &found_actuals))
        {
            err = 1;
            goto done;
        }

        /* 
         *   If we found no actuals, then this wasn't really an invocation
         *   of the macro after all - a function-like macro invoked with
         *   no arguments is simply not replaced.  Store the original text
         *   in the output buffer and return success.  
         */
        if (!found_actuals)
        {
            /* copy the original text */
            expbuf->copy(srcbuf->get_text() + macro_srcbuf_ofs,
                         startofs - macro_srcbuf_ofs);

            /* 
             *   restore the source read pointer to where it was when we
             *   started 
             */
            src->set((char *)srcbuf->get_text() + startofs);

            /* return success */
            err = 0;
            goto done;
        }
    }

    /* 
     *   if there are arguments, replace the macro and substitute actuals
     *   for the formals; otherwise, just copy the replacement text
     *   directly 
     */
    if (entry->get_argc() != 0)
    {
        /* substitute the actuals */
        if (substitute_macro_actuals(rsc, subexp, entry, srcbuf,
                                     argofs, arglen, allow_defined))
        {
            err = 1;
            goto done;
        }

        /* set up to parse from the expansion buffer */
        start = subexp->get_text();
        end = start + subexp->get_text_len();
    }
    else
    {
        /* 
         *   use our local source buffer that simply references the
         *   original expansion text, rather than making a copy of the
         *   expansion text 
         */
        start = entry->get_expansion();
        end = start + entry->get_expan_len();
    }

    /* copy the expansion into the output buffer */
    expbuf->copy(start, end - start);

    /*
     *   After the end of the expansion sequence, insert the
     *   fully-expanded flag plus a pointer to the symbol table entry that
     *   we just expanded.  This will allow us to detect during the
     *   re-scan of the expansion text that this symbol has already been
     *   expanded, in which case we must suppress further expansion of the
     *   symbol.  This allows us to follow the ANSI C rules for recursive
     *   macro usage.  
     */
    flagbuf[0] = TOK_MACRO_EXP_END;
    memcpy(&flagbuf[1], &entry, sizeof(entry));
    expbuf->append(flagbuf, sizeof(flagbuf));

    /* indicate that we expanded the macro */
    *expanded = TRUE;

    /* success */
    err = 0;

done:
    /* return the result */
    return err;
}